

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::CheckIndexWithValue<wabt::SharedValidator::FuncType>
          (SharedValidator *this,Var *var,
          vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
          *values,FuncType *out,char *desc)

{
  uint uVar1;
  pointer pFVar2;
  Result RVar3;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> vStack_a0;
  undefined8 local_88;
  Var local_78;
  
  Var::Var(&local_78,var);
  RVar3 = CheckIndex(this,&local_78,
                     (int)((ulong)((long)(values->
                                         super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(values->
                                        super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     -0x49249249,desc);
  Var::~Var(&local_78);
  if (out != (FuncType *)0x0) {
    if (RVar3.enum_ == Ok) {
      if (var->type_ != Index) {
        __assert_fail("is_index()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                      ,0x3b,"Index wabt::Var::index() const");
      }
      uVar1 = (var->field_2).index_;
      pFVar2 = (values->
               super__Vector_base<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_b8,&pFVar2[uVar1].params);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&vStack_a0,&pFVar2[uVar1].results);
      local_88 = CONCAT44(local_88._4_4_,pFVar2[uVar1].type_index);
    }
    else {
      vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88 = 0;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&out->params,&local_b8);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=(&out->results,&vStack_a0);
    out->type_index = (Index)local_88;
    if (vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_a0.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (Result)RVar3.enum_;
}

Assistant:

Result SharedValidator::CheckIndexWithValue(Var var,
                                            const std::vector<T>& values,
                                            T* out,
                                            const char* desc) {
  Result result = CheckIndex(var, values.size(), desc);
  if (out) {
    *out = Succeeded(result) ? values[var.index()] : T{};
  }
  return result;
}